

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsMajor.hpp
# Opt level: O1

string * __thiscall
sciplot::TicsSpecsMajor::repr_abi_cxx11_(string *__return_storage_ptr__,TicsSpecsMajor *this)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  runtime_error *this_00;
  string baserepr;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  pcVar1 = (this->m_axis)._M_dataplus._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + (this->m_axis)._M_string_length);
  TicsSpecsBaseOf<sciplot::TicsSpecsMajor>::repr
            (&local_208,&this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>).
      super_ShowSpecsOf<sciplot::TicsSpecsMajor>.m_show != false) {
    sVar2 = (this->m_start)._M_string_length;
    if ((sVar2 == 0) || ((this->m_increment)._M_string_length != 0)) {
      sVar3 = (this->m_end)._M_string_length;
      if ((sVar3 == 0) || ((this->m_increment)._M_string_length != 0)) {
        if (sVar2 != 0 || sVar3 == 0) {
          std::__cxx11::stringstream::stringstream(local_1a8);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_198,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_198,(this->m_at)._M_dataplus._M_p,(this->m_at)._M_string_length)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_198,(this->m_add)._M_dataplus._M_p,
                              (this->m_add)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_198,(this->m_logscale)._M_dataplus._M_p,
                              (this->m_logscale)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          std::__cxx11::stringbuf::str();
          internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_1a8);
          std::ios_base::~ios_base(local_128);
          goto LAB_00141e05;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "You have called method TicsSpecsMajor::end but not TicsSpecsMajor::start.");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "You have called method TicsSpecsMajor::end but not TicsSpecsMajor::increment.");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "You have called method TicsSpecsMajor::start but not TicsSpecsMajor::increment.");
    }
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
LAB_00141e05:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto TicsSpecsMajor::repr() const -> std::string
{
    const auto baserepr = TicsSpecsBaseOf<TicsSpecsMajor>::repr(m_axis);

    if(isHidden())
        return baserepr;

    if(m_start.size() && m_increment.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::start but not TicsSpecsMajor::increment.");
    if(m_end.size() && m_increment.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::end but not TicsSpecsMajor::increment.");
    if(m_end.size() && m_start.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::end but not TicsSpecsMajor::start.");

    std::stringstream ss;
    ss << baserepr << " ";
    ss << m_at << " ";
    ss << m_add << " ";
    ss << m_logscale << " ";
    return internal::removeExtraWhitespaces(ss.str());
}